

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SpreadsheetMode.cpp
# Opt level: O3

void __thiscall KDReports::Test::initTestCase(Test *this)

{
  QDebug QVar1;
  int iVar2;
  char16_t *pcVar3;
  QChar *pQVar4;
  QByteArrayView QVar5;
  QByteArrayView QVar6;
  QByteArrayView QVar7;
  QByteArrayView QVar8;
  QFontInfo info;
  QFont font;
  QDebug local_b0;
  QArrayDataPointer<char16_t> local_a8;
  QFontInfo local_90 [8];
  QByteArrayView local_88;
  QDebug local_78;
  char *local_70;
  QFont local_68 [16];
  QArrayDataPointer<char16_t> local_58;
  char *local_40;
  
  QCoreApplication::setAttribute(AA_Use96Dpi,true);
  local_70 = "Noto Sans";
  QByteArrayView::QByteArrayView<const_char_*,_true>(&local_88,&local_70);
  QVar5.m_data = (storage_type *)local_88.m_size;
  QVar5.m_size = (qsizetype)&local_58;
  QString::fromUtf8(QVar5);
  local_a8.ptr = local_58.ptr;
  local_a8.d = local_58.d;
  local_58.d = (Data *)0x0;
  local_58.ptr = (char16_t *)0x0;
  local_a8.size = local_58.size;
  local_58.size = 0;
  QArrayDataPointer<char16_t>::~QArrayDataPointer(&local_58);
  QFont::QFont(local_68,(QString *)&local_a8,0x30,-1,false);
  QArrayDataPointer<char16_t>::~QArrayDataPointer(&local_a8);
  QFontInfo::QFontInfo(local_90,local_68);
  QFontInfo::family();
  pQVar4 = (QChar *)local_58.ptr;
  if ((QChar *)local_58.ptr == (QChar *)0x0) {
    pQVar4 = (QChar *)&QString::_empty;
  }
  iVar2 = QString::compare_helper(pQVar4,local_58.size,"Noto Sans",-1,CaseSensitive);
  fontFound = iVar2 == 0;
  QArrayDataPointer<char16_t>::~QArrayDataPointer(&local_58);
  local_58.d = (Data *)0x3000000002;
  local_58.ptr = 
  L"/workspace/llm4binary/github/license_c_cmakelists/KDAB[P]KDReports/unittests/SpreadsheetMode/SpreadsheetMode.cpp"
  ;
  local_58.size = 0x10c7f7;
  local_40 = "default";
  QMessageLogger::debug();
  QVar1.stream = local_b0.stream;
  local_70 = "Setting DPI to 96. ";
  QByteArrayView::QByteArrayView<const_char_*,_true>(&local_88,&local_70);
  QVar6.m_data = (storage_type *)local_88.m_size;
  QVar6.m_size = (qsizetype)&local_a8;
  QString::fromUtf8(QVar6);
  QTextStream::operator<<((QTextStream *)QVar1.stream,(QString *)&local_a8);
  QArrayDataPointer<char16_t>::~QArrayDataPointer(&local_a8);
  if (*(QTextStream *)(local_b0.stream + 0x30) == (QTextStream)0x1) {
    QTextStream::operator<<((QTextStream *)local_b0.stream,' ');
  }
  QVar1.stream = local_b0.stream;
  local_70 = "Noto Sans";
  QByteArrayView::QByteArrayView<const_char_*,_true>(&local_88,&local_70);
  QVar7.m_data = (storage_type *)local_88.m_size;
  QVar7.m_size = (qsizetype)&local_a8;
  QString::fromUtf8(QVar7);
  QTextStream::operator<<((QTextStream *)QVar1.stream,(QString *)&local_a8);
  QArrayDataPointer<char16_t>::~QArrayDataPointer(&local_a8);
  if (*(QTextStream *)(local_b0.stream + 0x30) == (QTextStream)0x1) {
    QTextStream::operator<<((QTextStream *)local_b0.stream,' ');
  }
  QVar1.stream = local_b0.stream;
  local_70 = "48 has a size of";
  QByteArrayView::QByteArrayView<const_char_*,_true>(&local_88,&local_70);
  QVar8.m_data = (storage_type *)local_88.m_size;
  QVar8.m_size = (qsizetype)&local_a8;
  QString::fromUtf8(QVar8);
  QTextStream::operator<<((QTextStream *)QVar1.stream,(QString *)&local_a8);
  QArrayDataPointer<char16_t>::~QArrayDataPointer(&local_a8);
  if (*(QTextStream *)(local_b0.stream + 0x30) == (QTextStream)0x1) {
    QTextStream::operator<<((QTextStream *)local_b0.stream,' ');
  }
  QFontMetrics::QFontMetrics((QFontMetrics *)&local_a8,local_68);
  iVar2 = QFontMetrics::height();
  QTextStream::operator<<((QTextStream *)local_b0.stream,iVar2);
  if (*(QTextStream *)(local_b0.stream + 0x30) == (QTextStream)0x1) {
    QTextStream::operator<<((QTextStream *)local_b0.stream,' ');
  }
  QFontMetrics::~QFontMetrics((QFontMetrics *)&local_a8);
  QDebug::~QDebug(&local_b0);
  local_58.d = (Data *)0x3100000002;
  local_58.ptr = 
  L"/workspace/llm4binary/github/license_c_cmakelists/KDAB[P]KDReports/unittests/SpreadsheetMode/SpreadsheetMode.cpp"
  ;
  local_58.size = 0x10c7f7;
  local_40 = "default";
  QMessageLogger::debug();
  operator<<((Stream *)&local_88,(QFont *)&local_78);
  QFontInfo::family();
  pcVar3 = local_a8.ptr;
  if (local_a8.ptr == (char16_t *)0x0) {
    pcVar3 = (char16_t *)&QString::_empty;
  }
  QDebug::putString((QChar *)&local_88,(ulong)pcVar3);
  if (*(QTextStream *)(local_88.m_size + 0x30) == (QTextStream)0x1) {
    QTextStream::operator<<((QTextStream *)local_88.m_size,' ');
  }
  QArrayDataPointer<char16_t>::~QArrayDataPointer(&local_a8);
  QDebug::~QDebug((QDebug *)&local_88);
  QDebug::~QDebug(&local_78);
  QFontInfo::~QFontInfo(local_90);
  QFont::~QFont(local_68);
  return;
}

Assistant:

void initTestCase()
    {
        // Force the DPI do the same value as on Windows
        // (mostly for testFontScaling)
        qApp->setAttribute(Qt::AA_Use96Dpi, true);
        QFont font(s_fontName, 48);
        QFontInfo info(font);
        fontFound = (info.family() == s_fontName);
        qDebug() << "Setting DPI to 96. " << s_fontName << "48 has a size of" << QFontMetrics(font).height();
        qDebug() << font << info.family();
        // Unfortunately, Qt on Mac OSX hardcodes 72 DPI, so we'll always have different results there.
    }